

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.cpp
# Opt level: O1

void * SRF02Thread(void *pParam)

{
  timeval tv;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int i;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char *__s;
  double *pdVar14;
  ulong uVar15;
  char *pcVar16;
  double *pdVar17;
  byte bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double tab_values [3];
  CHRONO chrono_period;
  double distances [16];
  double angles [16];
  double distances3 [16];
  double distances2 [16];
  double distances1 [16];
  char szTemp [256];
  SRF02 srf02;
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  timespec local_d48;
  double local_d38;
  double local_d30;
  long local_d28;
  int local_d1c;
  timeval local_d18;
  timespec local_d00;
  double local_cf0;
  double dStack_ce8;
  double local_ce0;
  double dStack_cd8;
  timespec local_cd0;
  int local_cc0;
  double local_cb8 [80];
  char local_a38 [256];
  SRF02 local_938;
  char local_238 [256];
  char local_138 [264];
  
  bVar18 = 0;
  builtin_strncpy(local_238,"SRF020.txt",0xb);
  memset(&local_938,0,0x700);
  iVar3 = clock_getres(4,&local_cd0);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_d00), iVar3 == 0)) {
    local_cc0 = 0;
    local_cf0 = 0.0;
    dStack_ce8 = 0.0;
    local_ce0 = 0.0;
    dStack_cd8 = 0.0;
  }
  local_d28 = 0x32;
  __s = "SRF02 disconnection failed.";
  bVar1 = false;
  local_d1c = 0;
LAB_0019d81d:
  lVar8 = (long)((int)local_d28 * 1000);
  do {
    if (local_cc0 == 0) {
      clock_gettime(4,&local_d48);
      local_cf0 = (double)local_d48.tv_sec;
      dStack_ce8 = (double)local_d48.tv_nsec;
      local_d48.tv_sec =
           (local_d48.tv_sec + (long)local_ce0 + (local_d48.tv_nsec + (long)dStack_cd8) / 1000000000
           ) - local_d00.tv_sec;
      local_d48.tv_nsec = (local_d48.tv_nsec + (long)dStack_cd8) % 1000000000 - local_d00.tv_nsec;
      if (local_d48.tv_nsec < 0) {
        local_d48.tv_sec = local_d48.tv_sec + local_d48.tv_nsec / 1000000000 + -1;
        local_d48.tv_nsec = local_d48.tv_nsec % 1000000000 + 1000000000;
      }
      local_ce0 = (double)local_d48.tv_sec;
      dStack_cd8 = (double)local_d48.tv_nsec;
    }
    iVar3 = clock_getres(4,&local_cd0);
    if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_d00), iVar3 == 0)) {
      local_cc0 = 0;
      local_ce0 = 0.0;
      dStack_cd8 = 0.0;
      local_cf0 = 0.0;
      dStack_ce8 = 0.0;
    }
    if (bPauseSRF02 == 0) {
      if (bRestartSRF02 != 0) {
        if (bVar1) {
          puts("Restarting a SRF02.");
          iVar3 = close((int)local_938.I2CBus);
          pcVar16 = "SRF02 disconnection failed.";
          if (iVar3 == 0) {
            pcVar16 = "SRF02 disconnected.";
          }
          puts(pcVar16);
        }
        bRestartSRF02 = 0;
        bVar1 = false;
      }
      if (!bVar1) {
        iVar3 = ConnectSRF02(&local_938,local_238);
        if (iVar3 != 0) {
          local_d48.tv_sec = 1;
          local_d48.tv_nsec = 0;
          bVar1 = false;
          nanosleep(&local_d48,(timespec *)0x0);
          bVar2 = true;
          goto LAB_0019e23a;
        }
        local_d28 = (long)local_938.threadperiod;
        local_d48.tv_sec = (local_d28 * 1000) / 1000000;
        local_d48.tv_nsec = ((local_d28 * 1000) % 1000000) * 1000;
        nanosleep(&local_d48,(timespec *)0x0);
        local_d18.tv_sec = 0;
        local_d18.tv_usec = 0;
        local_cb8[0x10] = 0.0;
        local_cb8[0x11] = 0.0;
        local_cb8[0x12] = 0.0;
        local_cb8[0x13] = 0.0;
        local_cb8[0x14] = 0.0;
        local_cb8[0x15] = 0.0;
        local_cb8[0x16] = 0.0;
        local_cb8[0x17] = 0.0;
        local_cb8[0x18] = 0.0;
        local_cb8[0x19] = 0.0;
        local_cb8[0x1a] = 0.0;
        local_cb8[0x1b] = 0.0;
        local_cb8[0x1c] = 0.0;
        local_cb8[0x1d] = 0.0;
        local_cb8[0x1e] = 0.0;
        local_cb8[0x1f] = 0.0;
        local_cb8[0] = 0.0;
        local_cb8[1] = 0.0;
        local_cb8[2] = 0.0;
        local_cb8[3] = 0.0;
        local_cb8[4] = 0.0;
        local_cb8[5] = 0.0;
        local_cb8[6] = 0.0;
        local_cb8[7] = 0.0;
        local_cb8[8] = 0.0;
        local_cb8[9] = 0.0;
        local_cb8[10] = 0.0;
        local_cb8[0xb] = 0.0;
        local_cb8[0xc] = 0.0;
        local_cb8[0xd] = 0.0;
        local_cb8[0xe] = 0.0;
        local_cb8[0xf] = 0.0;
        local_cb8[0x4e] = 0.0;
        local_cb8[0x4f] = 0.0;
        local_cb8[0x4c] = 0.0;
        local_cb8[0x4d] = 0.0;
        local_cb8[0x4a] = 0.0;
        local_cb8[0x4b] = 0.0;
        local_cb8[0x48] = 0.0;
        local_cb8[0x49] = 0.0;
        local_cb8[0x46] = 0.0;
        local_cb8[0x47] = 0.0;
        local_cb8[0x44] = 0.0;
        local_cb8[0x45] = 0.0;
        local_cb8[0x42] = 0.0;
        local_cb8[0x43] = 0.0;
        local_cb8[0x40] = 0.0;
        local_cb8[0x41] = 0.0;
        local_cb8[0x30] = 0.0;
        local_cb8[0x31] = 0.0;
        local_cb8[0x32] = 0.0;
        local_cb8[0x33] = 0.0;
        local_cb8[0x34] = 0.0;
        local_cb8[0x35] = 0.0;
        local_cb8[0x36] = 0.0;
        local_cb8[0x37] = 0.0;
        local_cb8[0x38] = 0.0;
        local_cb8[0x39] = 0.0;
        local_cb8[0x3a] = 0.0;
        local_cb8[0x3b] = 0.0;
        local_cb8[0x3c] = 0.0;
        local_cb8[0x3d] = 0.0;
        local_cb8[0x3e] = 0.0;
        local_cb8[0x3f] = 0.0;
        local_cb8[0x20] = 0.0;
        local_cb8[0x21] = 0.0;
        local_cb8[0x22] = 0.0;
        local_cb8[0x23] = 0.0;
        local_cb8[0x24] = 0.0;
        local_cb8[0x25] = 0.0;
        local_cb8[0x26] = 0.0;
        local_cb8[0x27] = 0.0;
        local_cb8[0x28] = 0.0;
        local_cb8[0x29] = 0.0;
        local_cb8[0x2a] = 0.0;
        local_cb8[0x2b] = 0.0;
        local_cb8[0x2c] = 0.0;
        local_cb8[0x2d] = 0.0;
        local_cb8[0x2e] = 0.0;
        local_cb8[0x2f] = 0.0;
        if ((FILE *)local_938.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)local_938.pfSaveFile);
          local_938.pfSaveFile = (FILE *)0x0;
        }
        bVar2 = false;
        bVar1 = true;
        if ((local_938.bSaveRawData == 0) || ((FILE *)local_938.pfSaveFile != (FILE *)0x0))
        goto LAB_0019e23a;
        if (local_938.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_a38,"srf02",6);
        }
        else {
          sprintf(local_a38,"%.127s",local_938.szCfgFilePath);
        }
        sVar5 = strlen(local_a38);
        uVar4 = (uint)sVar5;
        uVar15 = sVar5 & 0xffffffff;
        uVar6 = (int)uVar4 >> 0x1f & uVar4;
        uVar13 = sVar5 & 0xffffffff;
        break;
      }
      if (local_938.bParallel == 0) {
        iVar3 = Get5TelemetersSRF02(&local_938,local_cb8,local_cb8 + 1,local_cb8 + 2,local_cb8 + 3,
                                    local_cb8 + 4,10);
        if (iVar3 == 0) {
          local_d48.tv_nsec = 10000000;
          goto LAB_0019ddaa;
        }
      }
      else {
        iVar3 = Get5TelemetersParallelSRF02
                          (&local_938,local_cb8,local_cb8 + 1,local_cb8 + 2,local_cb8 + 3,
                           local_cb8 + 4);
        if (iVar3 == 0) goto LAB_0019db38;
      }
      puts("Connection to a SRF02 lost.");
      iVar3 = close((int)local_938.I2CBus);
      pcVar16 = "SRF02 disconnection failed.";
      if (iVar3 == 0) {
        pcVar16 = "SRF02 disconnected.";
      }
      puts(pcVar16);
      local_d48.tv_sec = lVar8 / 1000000;
      local_d48.tv_nsec = (lVar8 % 1000000) * 1000;
    }
    else {
      if (bVar1) {
        puts("SRF02 paused.");
        iVar3 = close((int)local_938.I2CBus);
        pcVar16 = "SRF02 disconnection failed.";
        if (iVar3 == 0) {
          pcVar16 = "SRF02 disconnected.";
        }
        puts(pcVar16);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_0019e38d;
      }
      local_d48.tv_sec = 0;
      local_d48.tv_nsec = 100000000;
    }
    bVar1 = false;
    nanosleep(&local_d48,(timespec *)0x0);
  } while( true );
  while (uVar13 = (ulong)(uVar11 - 1), uVar7 = uVar11, local_a38[uVar15 & 0xffffffff] != '.') {
    uVar15 = uVar15 - 1;
    uVar11 = (uint)uVar13;
    uVar13 = (ulong)(uVar6 - 1);
    uVar7 = uVar6;
    if ((int)uVar11 < 1) break;
  }
  if ((int)uVar7 <= (int)uVar4 && 1 < (int)uVar7) {
    memset(local_a38 + uVar13,0,sVar5 - uVar13);
  }
  pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
  pcVar16 = strtimeex_fns();
  bVar2 = false;
  sprintf(local_138,"log/%.127s_%.64s.txt",local_a38,pcVar16);
  pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
  local_938.pfSaveFile = (FILE *)fopen(local_138,"wb");
  if ((FILE *)local_938.pfSaveFile == (FILE *)0x0) {
    puts("Unable to create SRF02 data file.");
    bVar2 = false;
    goto LAB_0019e38d;
  }
LAB_0019e23a:
  if ((bVar2) && (local_d1c = local_d1c + 1, ExitOnErrorCount <= local_d1c && 0 < ExitOnErrorCount))
  {
    bExit = 1;
  }
  if (bExit != 0) {
LAB_0019e38d:
    if (local_cc0 == 0) {
      clock_gettime(4,&local_d48);
      local_cf0 = (double)local_d48.tv_sec;
      dStack_ce8 = (double)local_d48.tv_nsec;
      local_d48.tv_sec =
           (local_d48.tv_sec + (long)local_ce0 + (local_d48.tv_nsec + (long)dStack_cd8) / 1000000000
           ) - local_d00.tv_sec;
      local_d48.tv_nsec = (local_d48.tv_nsec + (long)dStack_cd8) % 1000000000 - local_d00.tv_nsec;
      if (local_d48.tv_nsec < 0) {
        local_d48.tv_sec = local_d48.tv_sec + local_d48.tv_nsec / 1000000000 + -1;
        local_d48.tv_nsec = local_d48.tv_nsec % 1000000000 + 1000000000;
      }
      local_ce0 = (double)local_d48.tv_sec;
      dStack_cd8 = (double)local_d48.tv_nsec;
    }
    if ((FILE *)local_938.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)local_938.pfSaveFile);
      local_938.pfSaveFile = (FILE *)0x0;
    }
    if (!bVar2) {
      iVar3 = close((int)local_938.I2CBus);
      if (iVar3 == 0) {
        __s = "SRF02 disconnected.";
      }
      puts(__s);
    }
    if (bExit == 0) {
      bExit = 1;
    }
    return (void *)0x0;
  }
  goto LAB_0019d81d;
LAB_0019db38:
  local_d48.tv_nsec = 20000000;
LAB_0019ddaa:
  local_d48.tv_sec = 0;
  nanosleep(&local_d48,(timespec *)0x0);
  iVar3 = gettimeofday(&local_d18,(__timezone_ptr_t)0x0);
  if (iVar3 != 0) {
    local_d18.tv_sec = 0;
    local_d18.tv_usec = 0;
  }
  if (local_938.bMedianFilter != 0) {
    pdVar14 = local_cb8 + 0x30;
    pdVar17 = local_cb8 + 0x20;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pdVar17 = *pdVar14;
      pdVar14 = pdVar14 + (ulong)bVar18 * -2 + 1;
      pdVar17 = pdVar17 + (ulong)bVar18 * -2 + 1;
    }
    pdVar14 = local_cb8 + 0x40;
    pdVar17 = local_cb8 + 0x30;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pdVar17 = *pdVar14;
      pdVar14 = pdVar14 + (ulong)bVar18 * -2 + 1;
      pdVar17 = pdVar17 + (ulong)bVar18 * -2 + 1;
    }
    pdVar14 = local_cb8;
    pdVar17 = local_cb8 + 0x40;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pdVar17 = *pdVar14;
      pdVar14 = pdVar14 + (ulong)bVar18 * -2 + 1;
      pdVar17 = pdVar17 + (ulong)bVar18 * -2 + 1;
    }
    lVar8 = 0;
    do {
      local_d48.tv_sec = (__time_t)local_cb8[lVar8 + 0x40];
      local_d48.tv_nsec = (long)local_cb8[lVar8 + 0x30];
      local_d38 = local_cb8[lVar8 + 0x20];
      lVar9 = 1;
      lVar12 = 0;
      lVar10 = lVar9;
      do {
        do {
          dVar21 = (double)(&local_d48.tv_sec)[lVar12];
          if ((double)(&local_d48.tv_sec)[lVar9] < dVar21) {
            (&local_d48.tv_sec)[lVar12] = (&local_d48.tv_sec)[lVar9];
            (&local_d48.tv_sec)[lVar9] = (__time_t)dVar21;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar12 = lVar12 + 1;
        lVar9 = lVar10 + 1;
        lVar10 = lVar9;
      } while (lVar12 != 2);
      local_cb8[lVar8] = (double)local_d48.tv_nsec;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
  }
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  dVar20 = local_938.x[0];
  dVar21 = local_cb8[0];
  dVar19 = cos(local_938.psi[0]);
  dVar22 = local_938.y[0];
  dVar20 = dVar19 * dVar21 + dVar20;
  local_d30 = local_cb8[0];
  dVar21 = sin(local_938.psi[0]);
  dVar22 = dVar21 * local_d30 + dVar22;
  local_cb8[0x10] = atan2(dVar22,dVar20);
  dVar21 = dVar22 * dVar22 + dVar20 * dVar20;
  if (dVar21 < 0.0) {
    local_cb8[0] = sqrt(dVar21);
  }
  else {
    local_cb8[0] = SQRT(dVar21);
  }
  dVar20 = local_938.x[1];
  dVar21 = local_cb8[1];
  dVar19 = cos(local_938.psi[1]);
  dVar22 = local_938.y[1];
  dVar20 = dVar19 * dVar21 + dVar20;
  local_d30 = local_cb8[1];
  dVar21 = sin(local_938.psi[1]);
  dVar22 = dVar21 * local_d30 + dVar22;
  local_cb8[0x11] = atan2(dVar22,dVar20);
  dVar21 = dVar22 * dVar22 + dVar20 * dVar20;
  if (dVar21 < 0.0) {
    local_cb8[1] = sqrt(dVar21);
  }
  else {
    local_cb8[1] = SQRT(dVar21);
  }
  dVar20 = local_938.x[2];
  dVar21 = local_cb8[2];
  dVar19 = cos(local_938.psi[2]);
  dVar22 = local_938.y[2];
  dVar20 = dVar19 * dVar21 + dVar20;
  local_d30 = local_cb8[2];
  dVar21 = sin(local_938.psi[2]);
  dVar22 = dVar21 * local_d30 + dVar22;
  local_cb8[0x12] = atan2(dVar22,dVar20);
  dVar21 = dVar22 * dVar22 + dVar20 * dVar20;
  if (dVar21 < 0.0) {
    local_cb8[2] = sqrt(dVar21);
  }
  else {
    local_cb8[2] = SQRT(dVar21);
  }
  dVar20 = local_938.x[3];
  dVar21 = local_cb8[3];
  dVar19 = cos(local_938.psi[3]);
  dVar22 = local_938.y[3];
  dVar20 = dVar19 * dVar21 + dVar20;
  local_d30 = local_cb8[3];
  dVar21 = sin(local_938.psi[3]);
  dVar22 = dVar21 * local_d30 + dVar22;
  local_cb8[0x13] = atan2(dVar22,dVar20);
  dVar21 = dVar22 * dVar22 + dVar20 * dVar20;
  if (dVar21 < 0.0) {
    local_cb8[3] = sqrt(dVar21);
  }
  else {
    local_cb8[3] = SQRT(dVar21);
  }
  distance_above = local_938.z[4] + local_cb8[4];
  tv.tv_usec = local_d18.tv_usec;
  tv.tv_sec = local_d18.tv_sec;
  set_htelemeters_vectors_SRF02(local_cb8 + 0x10,local_cb8,4,tv);
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  bVar1 = true;
  bVar2 = false;
  goto LAB_0019e23a;
}

Assistant:

THREAD_PROC_RETURN_VALUE SRF02Thread(void* pParam)
{
	SRF02 srf02;
	double x = 0, y = 0, z = 0;
	struct timeval tv;
	int nbhtelemeters = 0, nbvtelemeters = 0, nbtelemeters = 0;
	double angles[MAX_NB_DEVICES_SRF02];
	double distances[MAX_NB_DEVICES_SRF02];
	double distances1[MAX_NB_DEVICES_SRF02];
	double distances2[MAX_NB_DEVICES_SRF02];
	double distances3[MAX_NB_DEVICES_SRF02];
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	sprintf(szCfgFilePath, "SRF020.txt");

	memset(&srf02, 0, sizeof(SRF02));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//uSleep(1000*threadperiod);

		if (bPauseSRF02) 
		{
			if (bConnected)
			{
				printf("SRF02 paused.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSRF02) 
		{
			if (bConnected)
			{
				printf("Restarting a SRF02.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			bRestartSRF02 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSRF02(&srf02, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = srf02.threadperiod;
				uSleep(1000*threadperiod);

				memset(&tv, 0, sizeof(tv));
				memset(angles, 0, sizeof(angles));
				memset(distances, 0, sizeof(distances));
				memset(distances1, 0, sizeof(distances1));
				memset(distances2, 0, sizeof(distances2));
				memset(distances3, 0, sizeof(distances3));

				if (srf02.pfSaveFile != NULL)
				{
					fclose(srf02.pfSaveFile); 
					srf02.pfSaveFile = NULL;
				}
				if ((srf02.bSaveRawData)&&(srf02.pfSaveFile == NULL)) 
				{
					if (strlen(srf02.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", srf02.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "srf02");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					srf02.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (srf02.pfSaveFile == NULL) 
					{
						printf("Unable to create SRF02 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			//if ((srf02.telem1chan != -1)&&(srf02.telem2chan != -1)&&(srf02.telem3chan != -1)&&(srf02.telem4chan != -1)&&
			//	(srf02.telem5chan != -1))
			{
				// Assume 4 planar+1 up vertical telemeters...
				nbhtelemeters = 4; nbvtelemeters = 1; nbtelemeters = nbhtelemeters+nbvtelemeters;
				if (srf02.bParallel)
				{
					if (Get5TelemetersParallelSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4]) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(20);
				}
				else
				{
					if (Get5TelemetersSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4], 10) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(10);
				}
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
				if (srf02.bMedianFilter)
				{
					// Median filter with the 3 last values.
					memcpy(distances3, distances2, sizeof(distances));
					memcpy(distances2, distances1, sizeof(distances));
					memcpy(distances1, distances, sizeof(distances));
					for (i = 0; i < nbtelemeters; i++)
					{
						double tab_values[3] = { distances1[i], distances2[i], distances3[i] };					
						distances[i] = median(tab_values, 3);
					}
				}
				//printf("%f %f %f %f %f\n", distances[0], distances[1], distances[2], distances[3], distances[4]);
				EnterCriticalSection(&StateVariablesCS);
				i = 0;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 1;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 2;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 3;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));

				// Up vertical...
				i = 4;
				z = srf02.z[i]+distances[i];
				distance_above = z;

				set_htelemeters_vectors_SRF02(angles, distances, nbhtelemeters, tv);
				LeaveCriticalSection(&StateVariablesCS);
			}
			//else uSleep(1000*threadperiod);
		}

		//printf("SRF02Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}
	
	StopChronoQuick(&chrono_period);

	if (srf02.pfSaveFile != NULL)
	{
		fclose(srf02.pfSaveFile); 
		srf02.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSRF02(&srf02);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}